

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QOpenFileLineEdit.cpp
# Opt level: O2

void QOpenFileLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QStringList *filter;
  QArrayDataPointer<QString> *this;
  code *pcVar1;
  long lVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QString *pQVar5;
  Options OVar6;
  QArrayDataPointer<QString> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      filePathChanged((QOpenFileLineEdit *)_o,(QString *)_a[1]);
      return;
    }
    if (_id == 0) {
      embededActionPositionChanged((QOpenFileLineEdit *)_o,*_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (5 < (uint)_id) {
      return;
    }
    this = (QArrayDataPointer<QString> *)*_a;
    switch(_id) {
    case 0:
      OVar6.i = embededActionPosition((QOpenFileLineEdit *)_o);
      goto LAB_00181f7c;
    case 1:
      filePath((QString *)&local_28,(QOpenFileLineEdit *)_o);
      break;
    case 2:
      caption((QString *)&local_28,(QOpenFileLineEdit *)_o);
      break;
    case 3:
      directory((QString *)&local_28,(QOpenFileLineEdit *)_o);
      break;
    case 4:
      QOpenFileLineEdit::filter((QStringList *)&local_28,(QOpenFileLineEdit *)_o);
      QArrayDataPointer<QString>::operator=(this,&local_28);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
      return;
    case 5:
      OVar6 = options((QOpenFileLineEdit *)_o);
LAB_00181f7c:
      *(Int *)&this->d = OVar6.i;
      return;
    }
    pDVar4 = this->d;
    pQVar5 = this->ptr;
    this->d = local_28.d;
    this->ptr = local_28.ptr;
    qVar3 = this->size;
    this->size = local_28.size;
    local_28.d = pDVar4;
    local_28.ptr = pQVar5;
    local_28.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_28);
    break;
  case WriteProperty:
    if ((uint)_id < 6) {
      filter = (QStringList *)*_a;
      switch(_id) {
      case 0:
        setEmbededActionPosition((QOpenFileLineEdit *)_o,*(ActionPosition *)&(filter->d).d);
        return;
      case 1:
        setFilePath((QOpenFileLineEdit *)_o,(QString *)filter);
        return;
      case 2:
        setCaption((QOpenFileLineEdit *)_o,(QString *)filter);
        return;
      case 3:
        setDirectory((QOpenFileLineEdit *)_o,(QString *)filter);
        return;
      case 4:
        setFilter((QOpenFileLineEdit *)_o,filter);
        return;
      case 5:
        setOptions((QOpenFileLineEdit *)_o,(Options)*(Int *)&(filter->d).d);
        return;
      }
    }
    break;
  case IndexOfMethod:
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == embededActionPositionChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == filePathChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
  return;
}

Assistant:

void QOpenFileLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QOpenFileLineEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->embededActionPositionChanged((*reinterpret_cast< std::add_pointer_t<QLineEdit::ActionPosition>>(_a[1]))); break;
        case 1: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QOpenFileLineEdit::*)(QLineEdit::ActionPosition );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QOpenFileLineEdit::embededActionPositionChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QOpenFileLineEdit::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QOpenFileLineEdit::filePathChanged)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QOpenFileLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QLineEdit::ActionPosition*>(_v) = _t->embededActionPosition(); break;
        case 1: *reinterpret_cast< QString*>(_v) = _t->filePath(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 3: *reinterpret_cast< QString*>(_v) = _t->directory(); break;
        case 4: *reinterpret_cast< QStringList*>(_v) = _t->filter(); break;
        case 5: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QOpenFileLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEmbededActionPosition(*reinterpret_cast< QLineEdit::ActionPosition*>(_v)); break;
        case 1: _t->setFilePath(*reinterpret_cast< QString*>(_v)); break;
        case 2: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 4: _t->setFilter(*reinterpret_cast< QStringList*>(_v)); break;
        case 5: _t->setOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}